

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void dynamic_suite::test_number(void)

{
  bool bVar1;
  value_type input [5];
  variable value;
  iarchive in;
  undefined4 local_e8;
  type_conflict8 local_e4;
  uchar local_e0 [8];
  type local_d8;
  undefined1 local_b8;
  iarchive local_a8;
  
  local_e0[4] = '?';
  local_e0[0] = 0xc5;
  local_e0[1] = '\0';
  local_e0[2] = '\0';
  local_e0[3] = 0x80;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>(&local_a8,(uchar (*) [5])local_e0)
  ;
  local_b8 = 0;
  local_d8._0_4_ = 0;
  trial::protocol::bintoken::iarchive::
  load_override<trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_a8,(basic_variable<std::allocator<char>_> *)&local_d8.__align);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)&local_d8.__align);
  local_e4 = (type_conflict8)CONCAT31(local_e4._1_3_,bVar1);
  local_e8 = CONCAT31(local_e8._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value.is<real>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3b6,"void dynamic_suite::test_number()",&local_e4,&local_e8);
  local_e4 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                       ((basic_variable<std::allocator<char>_> *)&local_d8.__align);
  local_e8 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("value.value<float>()","1.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3b7,"void dynamic_suite::test_number()",&local_e4,&local_e8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_d8.__align);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void test_number()
{
    const value_type input[] = { bintoken::token::code::float32, 0x00, 0x00, 0x80, 0x3F };
    format::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.is<real>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(value.value<float>(), 1.0f);
}